

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O0

newtRef NcSendWithArgArray(newtRefArg receiver,newtRefArg sym,_Bool ignore,newtRefArg args)

{
  _Bool _Var1;
  newtRef nVar2;
  newtRef inFunction;
  newtRefVar fn;
  newtRefVar impl;
  newtRefVar result;
  newtRefArg args_local;
  _Bool ignore_local;
  newtRefArg sym_local;
  newtRefArg receiver_local;
  
  impl = 0xfff2;
  _Var1 = NewtRefIsSymbol(sym);
  if (_Var1) {
    _Var1 = NewtRefIsFrame(receiver);
    if ((_Var1) || (_Var1 = NewtRefIsNIL(receiver), _Var1)) {
      nVar2 = NcFullLookupFrame(receiver,sym);
      if (nVar2 == 0xfff2) {
        if (!ignore) {
          nVar2 = NewtThrow(-0xbea9,sym);
          return nVar2;
        }
      }
      else {
        inFunction = NsGetSlot(2,nVar2,sym);
        impl = NVMMessageSendWithArgArray(nVar2,receiver,inFunction,args);
      }
      receiver_local = impl;
    }
    else {
      receiver_local = NewtThrow(-0xbd10,receiver);
    }
  }
  else {
    receiver_local = NewtThrow(-0xbd1a,sym);
  }
  return receiver_local;
}

Assistant:

newtRef NcSendWithArgArray(newtRefArg receiver, newtRefArg sym, bool ignore, newtRefArg args)
{
    newtRefVar	result = kNewtRefUnbind;
    newtRefVar	impl;
    newtRefVar	fn;

    if (! NewtRefIsSymbol(sym))
    {
        return NewtThrow(kNErrNotASymbol, sym);
    }

    if (! NewtRefIsFrame(receiver) && ! NewtRefIsNIL(receiver))
    {
        return NewtThrow(kNErrNotAFrame, receiver);
    }

    impl = NcFullLookupFrame(receiver, sym);

    if (impl != kNewtRefUnbind)
    {
        fn = NcGetSlot(impl, sym);
        result = NVMMessageSendWithArgArray(impl, receiver, fn, args);
    }
    else
    {
        if (! ignore)
            return NewtThrow(kNErrUndefinedMethod, sym);
    }

    return result;
}